

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O0

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  int wd_00;
  int *piVar1;
  size_t sVar2;
  int wd;
  int err;
  int events;
  size_t len;
  watcher_list *w;
  uint flags_local;
  char *path_local;
  uv_fs_event_cb cb_local;
  uv_fs_event_t *handle_local;
  
  if ((handle->flags & 4) == 0) {
    handle_local._4_4_ = init_inotify(handle->loop);
    if (handle_local._4_4_ == 0) {
      wd_00 = uv__inotify_add_watch(handle->loop->inotify_fd,path,0xfc6);
      if (wd_00 == -1) {
        piVar1 = __errno_location();
        handle_local._4_4_ = -*piVar1;
      }
      else {
        len = (size_t)find_watcher(handle->loop,wd_00);
        if ((watcher_list *)len == (watcher_list *)0x0) {
          sVar2 = strlen(path);
          len = (size_t)uv__malloc(sVar2 + 0x49);
          if ((watcher_list *)len == (watcher_list *)0x0) {
            return -0xc;
          }
          ((watcher_list *)len)->wd = wd_00;
          memcpy((watcher_list *)(len + 0x48),path,sVar2 + 1);
          ((watcher_list *)len)->path = (char *)(len + 0x48);
          ((watcher_list *)len)->watchers[0] = ((watcher_list *)len)->watchers;
          ((watcher_list *)len)->watchers[1] = ((watcher_list *)len)->watchers;
          ((watcher_list *)len)->iterating = 0;
          watcher_root_RB_INSERT
                    ((watcher_root *)&handle->loop->inotify_watchers,(watcher_list *)len);
        }
        if (((handle->flags & 4) == 0) &&
           (handle->flags = handle->flags | 4, (handle->flags & 8) != 0)) {
          handle->loop->active_handles = handle->loop->active_handles + 1;
        }
        handle->watchers[0] = (void *)(len + 0x20);
        handle->watchers[1] = *(void **)(len + 0x28);
        *(void ***)handle->watchers[1] = handle->watchers;
        *(void ***)(len + 0x28) = handle->watchers;
        handle->path = *(char **)(len + 0x38);
        handle->cb = cb;
        handle->wd = wd_00;
        handle_local._4_4_ = 0;
      }
    }
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  err = init_inotify(handle->loop);
  if (err)
    return err;

  events = UV__IN_ATTRIB
         | UV__IN_CREATE
         | UV__IN_MODIFY
         | UV__IN_DELETE
         | UV__IN_DELETE_SELF
         | UV__IN_MOVE_SELF
         | UV__IN_MOVED_FROM
         | UV__IN_MOVED_TO;

  wd = uv__inotify_add_watch(handle->loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(handle->loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  QUEUE_INIT(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, CAST(&handle->loop->inotify_watchers), w);

no_insert:
  uv__handle_start(handle);
  QUEUE_INSERT_TAIL(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}